

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O1

quaternion dja::normalize(quaternion *q)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  quaternion qVar6;
  
  fVar1 = q->re;
  fVar2 = (q->im).x;
  fVar3 = (q->im).y;
  fVar4 = (q->im).z;
  fVar5 = fVar4 * fVar4 + fVar3 * fVar3 + fVar1 * fVar1 + fVar2 * fVar2;
  if (fVar5 < 0.0) {
    fVar5 = sqrtf(fVar5);
  }
  else {
    fVar5 = SQRT(fVar5);
  }
  fVar5 = 1.0 / fVar5;
  qVar6.im.y = fVar3 * fVar5;
  qVar6.im.x = fVar2 * fVar5;
  qVar6.re = fVar1 * fVar5;
  qVar6.im.z = fVar4 * fVar5;
  return qVar6;
}

Assistant:

Q normalize(const Q& q) {return Q(normalize(V4(q)));}